

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::PromiseIoStream::pumpTo
          (PromiseIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseNode *pPVar1;
  EventLoop *this_00;
  TaskSet *in_RCX;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX_00;
  ChainPromiseNode *extraout_RDX_01;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<unsigned_long> PVar4;
  undefined1 local_58 [8];
  PromiseNode *local_50;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (output[6]._vptr_AsyncOutputStream == (_func_int **)0x0) {
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_58);
    this_00 = (EventLoop *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3428:39),_kj::_::PropagateException>
               ::anon_class_24_3_31b3e6fc_for_func::operator());
    ((PromiseNode *)&this_00->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00461580;
    this_00->depthFirstInsertPoint = (Event **)output;
    (this_00->daemons).disposer = (Disposer *)amount;
    (this_00->daemons).ptr = in_RCX;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::PromiseIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar1 = local_48.ptr;
    pCVar2 = OVar3.ptr;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_38;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         uStack_34;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         uStack_30;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uStack_2c;
    if ((EventLoop *)local_48.ptr != (EventLoop *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar2 = extraout_RDX_00;
    }
    pPVar1 = local_50;
    if (local_50 != (PromiseNode *)0x0) {
      local_50 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_58)
                (local_58,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
      pCVar2 = extraout_RDX_01;
    }
  }
  else {
    (**(code **)(*output[6]._vptr_AsyncOutputStream + 0x18))
              (this,output[6]._vptr_AsyncOutputStream,amount);
    pCVar2 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }